

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

bool __thiscall
S2Polygon::InitToOperation
          (S2Polygon *this,OpType op_type,SnapFunction *snap_function,S2Polygon *a,S2Polygon *b,
          S2Error *error)

{
  bool bVar1;
  pointer *__ptr;
  S2BooleanOperation op;
  Layer *local_d8;
  _Head_base<0UL,_S2Builder::Layer_*,_false> local_d0;
  S2Error *local_c8;
  S2Polygon *local_c0;
  Options local_b8;
  S2BooleanOperation local_90;
  
  local_c8 = error;
  S2BooleanOperation::Options::Options(&local_b8);
  S2BooleanOperation::Options::set_snap_function(&local_b8,snap_function);
  local_c0 = this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>((absl *)&local_d8,&local_c0);
  local_d0._M_head_impl = local_d8;
  local_d8 = (Layer *)0x0;
  S2BooleanOperation::S2BooleanOperation
            (&local_90,op_type,
             (unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)&local_d0,
             &local_b8);
  if (local_d0._M_head_impl != (Layer *)0x0) {
    (*(local_d0._M_head_impl)->_vptr_Layer[1])();
  }
  local_d0._M_head_impl = (Layer *)0x0;
  if (local_d8 != (Layer *)0x0) {
    (**(code **)(*(long *)local_d8 + 8))();
  }
  bVar1 = S2BooleanOperation::Build
                    (&local_90,&(a->index_).super_S2ShapeIndex,&(b->index_).super_S2ShapeIndex,
                     local_c8);
  S2BooleanOperation::~S2BooleanOperation(&local_90);
  if ((_Head_base<0UL,_S2Builder::SnapFunction_*,_false>)
      local_b8.snap_function_._M_t.
      super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>.
      _M_t.
      super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
      .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
      (_Head_base<0UL,_S2Builder::SnapFunction_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_b8.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
  }
  return bVar1;
}

Assistant:

bool S2Polygon::InitToOperation(S2BooleanOperation::OpType op_type,
                                const S2Builder::SnapFunction& snap_function,
                                const S2Polygon& a, const S2Polygon& b,
                                S2Error* error) {
  S2BooleanOperation::Options options;
  options.set_snap_function(snap_function);
  S2BooleanOperation op(op_type, make_unique<S2PolygonLayer>(this),
                         options);
  return op.Build(a.index_, b.index_, error);
}